

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::SourceCodeInfo::ByteSizeLong(SourceCodeInfo *this)

{
  long lVar1;
  Rep *pRVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  void **ppvVar8;
  
  sVar7 = (size_t)(this->location_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->location_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  if (sVar7 != 0) {
    lVar1 = sVar7 * 8;
    lVar6 = 0;
    do {
      sVar5 = SourceCodeInfo_Location::ByteSizeLong
                        (*(SourceCodeInfo_Location **)((long)ppvVar8 + lVar6));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar6 = lVar6 + 8;
    } while (lVar1 - lVar6 != 0);
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar7;
    return sVar7;
  }
  sVar7 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar7,
                     &this->_cached_size_);
  return sVar7;
}

Assistant:

size_t SourceCodeInfo::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  total_size += 1UL * this->_internal_location_size();
  for (const auto& msg : this->location_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}